

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

void __thiscall
CTcParser::add_inherited_templates
          (CTcParser *this,CTcSymObj *sc_sym,CTcObjTemplateItem *item_head,size_t item_cnt)

{
  inh_tpl_entry *piVar1;
  CTcObjTemplate *sc_tpl;
  inh_tpl_entry *tail;
  inh_tpl_entry *head;
  inh_tpl_entry *local_30;
  inh_tpl_entry *local_28;
  
  local_30 = (inh_tpl_entry *)0x0;
  local_28 = (inh_tpl_entry *)0x0;
  build_super_template_list(this,&local_28,&local_30,sc_sym);
  for (piVar1 = local_28; piVar1 != (inh_tpl_entry *)0x0; piVar1 = piVar1->nxt) {
    expand_and_add_inherited_template(this,sc_sym,item_head,piVar1->tpl);
  }
  for (sc_tpl = this->template_head_; sc_tpl != (CTcObjTemplate *)0x0; sc_tpl = sc_tpl->nxt_) {
    expand_and_add_inherited_template(this,sc_sym,item_head,sc_tpl);
  }
  expand_and_add_inherited_template(this,sc_sym,item_head,(CTcObjTemplate *)0x0);
  return;
}

Assistant:

void CTcParser::add_inherited_templates(CTcSymObj *sc_sym,
                                        CTcObjTemplateItem *item_head,
                                        size_t item_cnt)
{
    inh_tpl_entry *head;
    inh_tpl_entry *tail;
    inh_tpl_entry *cur;
    CTcObjTemplate *tpl;
    
    /* start with an empty list */
    head = tail = 0;

    /* 
     *   traverse the superclass tree, building a list of all unique
     *   templates inherited from the tree 
     */
    build_super_template_list(&head, &tail, sc_sym);

    /* expand our template for each item in the superclass template list */
    for (cur = head ; cur != 0 ; cur = cur->nxt)
        expand_and_add_inherited_template(sc_sym, item_head, cur->tpl);

    /* expand our template for each item in the root template list */
    for (tpl = template_head_ ; tpl != 0 ; tpl = tpl->nxt_)
        expand_and_add_inherited_template(sc_sym, item_head, tpl);

    /* 
     *   finally, add the trivial expansion (in other words, with the
     *   'inherited' keyword replaced by nothing) 
     */
    expand_and_add_inherited_template(sc_sym, item_head, 0);
}